

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Emu.cpp
# Opt level: O3

blargg_err_t __thiscall Spc_Emu::play_(Spc_Emu *this,long count,sample_t_conflict1 *out)

{
  sample_t_conflict1 **ppsVar1;
  sample_t_conflict1 *out_00;
  int iVar2;
  blargg_err_t pcVar3;
  ssize_t sVar4;
  size_t in_RCX;
  long count_00;
  ulong uVar5;
  ulong uVar6;
  
  if ((this->super_Music_Emu).sample_rate_ == 32000) {
    pcVar3 = play_and_filter(this,count,out);
    return pcVar3;
  }
  if (0 < count) {
    sVar4 = Fir_Resampler<24>::read(&this->resampler,(int)out,(void *)(count & 0xffffffff),in_RCX);
    iVar2 = (int)sVar4;
    uVar6 = count;
    while (uVar5 = uVar6 - (long)iVar2, uVar5 != 0 && (long)iVar2 <= (long)uVar6) {
      out_00 = (this->resampler).super_Fir_Resampler_.write_pos;
      count_00 = (long)(int)((long)(this->resampler).super_Fir_Resampler_.buf.begin_ +
                             ((this->resampler).super_Fir_Resampler_.buf.size_ * 2 - (long)out_00)
                            >> 1);
      pcVar3 = play_and_filter(this,count_00,out_00);
      if (pcVar3 != (blargg_err_t)0x0) {
        return pcVar3;
      }
      ppsVar1 = &(this->resampler).super_Fir_Resampler_.write_pos;
      *ppsVar1 = *ppsVar1 + count_00;
      sVar4 = Fir_Resampler<24>::read
                        (&this->resampler,(int)out + ((int)count - (int)uVar5) * 2,
                         (void *)(uVar5 & 0xffffffff),in_RCX);
      uVar6 = uVar5;
      iVar2 = (int)sVar4;
    }
  }
  return (blargg_err_t)0x0;
}

Assistant:

blargg_err_t Spc_Emu::play_( long count, sample_t* out )
{
	if ( sample_rate() == native_sample_rate )
		return play_and_filter( count, out );
	
	long remain = count;
	while ( remain > 0 )
	{
		remain -= resampler.read( &out [count - remain], remain );
		if ( remain > 0 )
		{
			long n = resampler.max_write();
			RETURN_ERR( play_and_filter( n, resampler.buffer() ) );
			resampler.write( n );
		}
	}
	check( remain == 0 );
	return 0;
}